

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsessionparams.cpp
# Opt level: O0

int __thiscall jrtplib::RTPSessionParams::SetUsePollThread(RTPSessionParams *this,bool usethread)

{
  bool usethread_local;
  RTPSessionParams *this_local;
  
  return -2;
}

Assistant:

int RTPSessionParams::SetUsePollThread(bool usethread)
{
#ifndef RTP_SUPPORT_THREAD
	JRTPLIB_UNUSED(usethread);
	return ERR_RTP_NOTHREADSUPPORT;
#else
	usepollthread = usethread;
	return 0;
#endif // RTP_SUPPORT_THREAD
}